

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::setInitialState
          (MultipleShootingTranscription *this,VectorDynSize *initialState)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined8 in_RSI;
  long in_RDI;
  OptimalControlProblem *in_stack_ffffffffffffff78;
  weak_ptr<iDynTree::optimalcontrol::DynamicalSystem> *this_00;
  weak_ptr<iDynTree::optimalcontrol::DynamicalSystem> local_48 [3];
  undefined8 local_18;
  bool local_1;
  
  local_18 = in_RSI;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x28));
  if (bVar1) {
    std::
    __shared_ptr_access<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x31803d);
    OptimalControlProblem::dynamicalSystem(in_stack_ffffffffffffff78);
    bVar1 = std::__weak_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>::
            expired((__weak_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                     *)0x318054);
    std::weak_ptr<iDynTree::optimalcontrol::DynamicalSystem>::~weak_ptr
              ((weak_ptr<iDynTree::optimalcontrol::DynamicalSystem> *)0x318062);
    if (bVar1) {
      iDynTree::reportError
                ("MultipleShootingTranscription","setInitialState",
                 "The optimal control problem does not point to any dynamical system.");
      local_1 = false;
    }
    else {
      std::
      __shared_ptr_access<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x3180a1);
      this_00 = local_48;
      OptimalControlProblem::dynamicalSystem(in_stack_ffffffffffffff78);
      std::weak_ptr<iDynTree::optimalcontrol::DynamicalSystem>::lock(this_00);
      peVar3 = std::
               __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x3180d1);
      iVar2 = (*peVar3->_vptr_DynamicalSystem[8])(peVar3,local_18);
      std::shared_ptr<iDynTree::optimalcontrol::DynamicalSystem>::~shared_ptr
                ((shared_ptr<iDynTree::optimalcontrol::DynamicalSystem> *)0x3180fc);
      std::weak_ptr<iDynTree::optimalcontrol::DynamicalSystem>::~weak_ptr
                ((weak_ptr<iDynTree::optimalcontrol::DynamicalSystem> *)0x318106);
      if ((((byte)iVar2 ^ 0xff) & 1) == 0) {
        local_1 = true;
      }
      else {
        iDynTree::reportError
                  ("MultipleShootingTranscription","setInitialState",
                   "Error while setting the initial state to the dynamical system.");
        local_1 = false;
      }
    }
  }
  else {
    iDynTree::reportError
              ("MultipleShootingTranscription","setInitialState",
               "The optimal control problem pointer is empty.");
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool setInitialState(const VectorDynSize &initialState) {
                if (!(m_ocproblem)){
                    reportError("MultipleShootingTranscription", "setInitialState", "The optimal control problem pointer is empty.");
                    return false;
                }

                if (m_ocproblem->dynamicalSystem().expired()){
                    reportError("MultipleShootingTranscription", "setInitialState", "The optimal control problem does not point to any dynamical system.");
                    return false;
                }

                if (!(m_ocproblem->dynamicalSystem().lock()->setInitialState(initialState))){
                    reportError("MultipleShootingTranscription", "setInitialState", "Error while setting the initial state to the dynamical system.");
                    return false;
                }

                return true;
            }